

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

QDate __thiscall
QtPrivate::QCalendarDayValidator::applyToDate
          (undefined8 param_1,undefined8 param_2,undefined8 param_3)

{
  long lVar1;
  ulong uVar2;
  QDate QVar3;
  long in_FS_OFFSET;
  QCalendar cal_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _cal_local = param_3;
  uVar2 = QCalendar::partsFromDate((QDate)&cal_local);
  if (uVar2 >> 0x20 == 0x80000000) {
    QVar3.jd = -0x8000000000000000;
  }
  else {
    QCalendar::daysInMonth((int)(YearMonthDay *)&cal_local,(int)(uVar2 >> 0x20));
    QVar3.jd = QCalendar::dateFromParts((YearMonthDay *)&cal_local);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDate)QVar3.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QCalendarDayValidator::applyToDate(QDate date, QCalendar cal) const
{
    auto parts = cal.partsFromDate(date);
    if (!parts.isValid())
        return QDate();
    parts.day = qMin(qMax(1, m_day), cal.daysInMonth(parts.month, parts.year));
    return cal.dateFromParts(parts);
}